

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

char * libssh2_session_methods(LIBSSH2_SESSION *session,int method_type)

{
  LIBSSH2_CRYPT_METHOD *local_28;
  LIBSSH2_KEX_METHOD *method;
  int method_type_local;
  LIBSSH2_SESSION *session_local;
  
  switch(method_type) {
  case 0:
    local_28 = (LIBSSH2_CRYPT_METHOD *)session->kex;
    break;
  case 1:
    local_28 = (LIBSSH2_CRYPT_METHOD *)session->hostkey;
    break;
  case 2:
    local_28 = (session->local).crypt;
    break;
  case 3:
    local_28 = (session->remote).crypt;
    break;
  case 4:
    local_28 = (LIBSSH2_CRYPT_METHOD *)(session->local).mac;
    break;
  case 5:
    local_28 = (LIBSSH2_CRYPT_METHOD *)(session->remote).mac;
    break;
  case 6:
    local_28 = (LIBSSH2_CRYPT_METHOD *)(session->local).comp;
    break;
  case 7:
    local_28 = (LIBSSH2_CRYPT_METHOD *)(session->remote).comp;
    break;
  case 8:
    session_local = (LIBSSH2_SESSION *)0x14685e;
    return (char *)session_local;
  case 9:
    session_local = (LIBSSH2_SESSION *)0x14685e;
    return (char *)session_local;
  default:
    _libssh2_error(session,-0x22,"Invalid parameter specified for method_type");
    return (char *)0x0;
  }
  if (local_28 == (LIBSSH2_CRYPT_METHOD *)0x0) {
    _libssh2_error(session,-0x11,"No method negotiated");
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    session_local = (LIBSSH2_SESSION *)local_28->name;
  }
  return (char *)session_local;
}

Assistant:

LIBSSH2_API const char *
libssh2_session_methods(LIBSSH2_SESSION * session, int method_type)
{
    /* All methods have char *name as their first element */
    const LIBSSH2_KEX_METHOD *method = NULL;

    switch(method_type) {
    case LIBSSH2_METHOD_KEX:
        method = session->kex;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        method = (LIBSSH2_KEX_METHOD *) session->hostkey;
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
        method = (LIBSSH2_KEX_METHOD *) session->local.crypt;
        break;

    case LIBSSH2_METHOD_CRYPT_SC:
        method = (LIBSSH2_KEX_METHOD *) session->remote.crypt;
        break;

    case LIBSSH2_METHOD_MAC_CS:
        method = (LIBSSH2_KEX_METHOD *) session->local.mac;
        break;

    case LIBSSH2_METHOD_MAC_SC:
        method = (LIBSSH2_KEX_METHOD *) session->remote.mac;
        break;

    case LIBSSH2_METHOD_COMP_CS:
        method = (LIBSSH2_KEX_METHOD *) session->local.comp;
        break;

    case LIBSSH2_METHOD_COMP_SC:
        method = (LIBSSH2_KEX_METHOD *) session->remote.comp;
        break;

    case LIBSSH2_METHOD_LANG_CS:
        return "";

    case LIBSSH2_METHOD_LANG_SC:
        return "";

    default:
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "Invalid parameter specified for method_type");
        return NULL;
    }

    if(!method) {
        _libssh2_error(session, LIBSSH2_ERROR_METHOD_NONE,
                       "No method negotiated");
        return NULL;
    }

    return method->name;
}